

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  uint uVar1;
  uint32_t *puVar2;
  MigrationSchema MVar3;
  Message *pMVar4;
  MessageFactory *pMVar5;
  int iVar6;
  undefined4 extraout_var;
  long *arg;
  DescriptorPool *pDVar7;
  undefined8 extraout_RAX;
  Descriptor *pDVar8;
  EnumDescriptor **ppEVar9;
  uint32_t uVar10;
  long lVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  void *unaff_R12;
  int iVar15;
  long lVar16;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  uint32_t *local_70;
  uint32_t *local_68;
  
  if (0 < descriptor->nested_type_count_) {
    lVar16 = 0;
    unaff_R12 = (void *)0x0;
    do {
      AssignMessageDescriptor
                (this,(Descriptor *)(&descriptor->nested_types_->super_SymbolBase + lVar16));
      unaff_R12 = (void *)((long)unaff_R12 + 1);
      lVar16 = lVar16 + 0xa0;
    } while ((long)unaff_R12 < (long)descriptor->nested_type_count_);
  }
  if (*this->default_instance_data_ == (Message *)0x0) goto LAB_00425d9c;
  iVar6 = (*((*this->default_instance_data_)->super_MessageLite)._vptr_MessageLite[4])();
  lVar16 = CONCAT44(extraout_var,iVar6);
  if (*(char *)(lVar16 + 0x3c) == '\x01') {
    AssignMessageDescriptor((AssignDescriptorsHelper *)&stack0xffffffffffffffc0);
    operator_delete(unaff_R12,0x70);
    _Unwind_Resume(extraout_RAX);
  }
  if (*(long *)(lVar16 + 0x48) == 0) goto LAB_00425d9c;
  *(Descriptor **)(lVar16 + 0x58) = descriptor;
  arg = (long *)operator_new(0x70);
  puVar2 = this->offsets_;
  MVar3 = *this->schemas_;
  iVar6 = MVar3.offsets_index;
  iVar15 = iVar6 + 1;
  uVar1 = puVar2[iVar6];
  uVar12 = 0xffffffff;
  if ((uVar1 & 1) == 0) {
    local_74 = 0xffffffff;
  }
  else {
    lVar11 = (long)iVar15;
    iVar15 = iVar6 + 2;
    local_74 = puVar2[lVar11];
  }
  if ((uVar1 & 2) != 0) {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    uVar12 = puVar2[lVar11];
  }
  uVar13 = 0xffffffff;
  if ((uVar1 & 4) == 0) {
    local_78 = 0xffffffff;
  }
  else {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    local_78 = puVar2[lVar11];
  }
  if ((uVar1 & 8) != 0) {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    uVar13 = puVar2[lVar11];
  }
  uVar14 = 0xffffffff;
  if ((uVar1 & 0x10) == 0) {
    local_7c = 0xffffffff;
  }
  else {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    local_7c = puVar2[lVar11];
  }
  if ((uVar1 & 0x20) != 0) {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    uVar14 = puVar2[lVar11];
  }
  uVar10 = 0xffffffff;
  if ((uVar1 & 0x40) != 0) {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    uVar10 = puVar2[lVar11];
  }
  if ((char)uVar1 < '\0') {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    if ((ulong)puVar2[lVar11] == 0xffffffff) goto LAB_00425c76;
    local_68 = puVar2 + (long)iVar6 + (ulong)puVar2[lVar11];
  }
  else {
LAB_00425c76:
    local_68 = (uint32_t *)0x0;
  }
  if ((uVar1 >> 8 & 1) == 0) {
LAB_00425cbc:
    local_70 = (uint32_t *)0x0;
  }
  else {
    lVar11 = (long)iVar15;
    iVar15 = iVar15 + 1;
    if ((ulong)puVar2[lVar11] == 0xffffffff) goto LAB_00425cbc;
    local_70 = puVar2 + (long)iVar6 + (ulong)puVar2[lVar11];
  }
  pMVar4 = *this->default_instance_data_;
  pDVar7 = DescriptorPool::internal_generated_pool();
  pMVar5 = this->factory_;
  *arg = (long)descriptor;
  arg[1] = (long)pMVar4;
  arg[2] = (long)(puVar2 + iVar15);
  arg[3] = (long)local_68;
  *(uint32_t *)(arg + 4) = local_74;
  *(uint32_t *)((long)arg + 0x24) = uVar12;
  *(uint32_t *)(arg + 5) = local_78;
  *(int *)((long)arg + 0x2c) = MVar3.object_size;
  *(uint32_t *)(arg + 6) = uVar13;
  arg[7] = (long)local_70;
  *(uint32_t *)(arg + 8) = local_7c;
  *(uint32_t *)((long)arg + 0x44) = uVar14;
  *(uint32_t *)(arg + 9) = uVar10;
  pDVar8 = descriptor;
  if (pDVar7 == (DescriptorPool *)0x0) {
    pDVar7 = DescriptorPool::internal_generated_pool();
    pDVar8 = (Descriptor *)*arg;
  }
  arg[10] = (long)pDVar7;
  arg[0xb] = (long)pMVar5;
  *(undefined4 *)((long)arg + 100) = 0;
  arg[0xd] = 0;
  *(int *)(arg + 0xc) = pDVar8->field_count_ + -1;
  internal::OnShutdownRun
            (internal::OnShutdownDelete<google::protobuf::Reflection>::anon_class_1_0_00000001::
             __invoke,arg);
  *(long **)(lVar16 + 0x50) = arg;
LAB_00425d9c:
  iVar6 = descriptor->enum_type_count_;
  if (0 < (long)iVar6) {
    ppEVar9 = this->file_level_enum_descriptors_;
    lVar16 = 0;
    do {
      *ppEVar9 = (EnumDescriptor *)(&descriptor->enum_types_->super_SymbolBase + lVar16);
      ppEVar9 = this->file_level_enum_descriptors_ + 1;
      this->file_level_enum_descriptors_ = ppEVar9;
      lVar16 = lVar16 + 0x58;
    } while ((long)iVar6 * 0x58 - lVar16 != 0);
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    // If there is no default instance we only want to initialize the descriptor
    // without updating the reflection.
    if (default_instance_data_[0] != nullptr) {
      auto& class_data = default_instance_data_[0]->GetClassData()->full();
      // If there is no descriptor_table in the class data, then it is not
      // interested in receiving reflection information either.
      if (class_data.descriptor_table != nullptr) {
        class_data.descriptor = descriptor;

        class_data.reflection = OnShutdownDelete(new Reflection(
            descriptor,
            MigrationToReflectionSchema(default_instance_data_, offsets_,
                                        *schemas_),
            DescriptorPool::internal_generated_pool(), factory_));
      }
    }
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
  }